

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic14::Run(UnitTest_semantic14 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  Terminator *pTVar3;
  Terminator *pTVar4;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string local_70;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "function test()     local a = 1     a = f()     return function() return a end end",""
            );
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a","");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_48,local_48 + local_40);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"f","");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_48,local_48 + local_40);
  pTVar4 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (pTVar3->scoping_ != LexicalScoping_Local) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"\'a->scoping_ == luna::LexicalScoping_Local\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (pTVar4->scoping_ != LexicalScoping_Global) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"\'f->scoping_ == luna::LexicalScoping_Global\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&PTR__Visitor_00187eb8;
  local_70._M_string_length = 0;
  (*(local_50._M_head_impl)->_vptr_SyntaxTree[2])(local_50._M_head_impl,&local_70,0);
  sVar2 = local_70._M_string_length;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a","");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_48,local_48 + local_40);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      (sVar2 + 8),(FindName *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (pTVar3->scoping_ != LexicalScoping_Upvalue) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"\'a2->scoping_ == luna::LexicalScoping_Upvalue\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (local_50._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_50._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic14)
{
    auto ast = Semantic("function test() "
                        "    local a = 1 "
                        "    a = f() "
                        "    return function() return a end "
                        "end");

    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto f = ASTFind<luna::Terminator>(ast, FindName("f"));
    EXPECT_TRUE(a->scoping_ == luna::LexicalScoping_Local);
    EXPECT_TRUE(f->scoping_ == luna::LexicalScoping_Global);

    auto ret = ASTFind<luna::ReturnStatement>(ast, AcceptAST());
    auto a2 = ASTFind<luna::Terminator>(ret->exp_list_, FindName("a"));
    EXPECT_TRUE(a2->scoping_ == luna::LexicalScoping_Upvalue);
}